

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

TextureFormatInfo *
tcu::getTextureFormatInfo(TextureFormatInfo *__return_storage_ptr__,TextureFormat *format)

{
  ChannelType channelType;
  ChannelOrder order;
  TextureSwizzle *pTVar1;
  uint uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  undefined8 uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vector<float,_4> res_3;
  Vector<float,_4> res_2;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vec2 cRange;
  Vec4 local_68;
  Vec4 local_58;
  Vec4 local_48;
  Vec4 local_38 [2];
  
  channelType = format->type;
  if (channelType == SIGNED_INT_1010102_REV) {
    (__return_storage_ptr__->valueMin).m_data[0] = -512.0;
    (__return_storage_ptr__->valueMin).m_data[1] = -512.0;
    (__return_storage_ptr__->valueMin).m_data[2] = -512.0;
    (__return_storage_ptr__->valueMin).m_data[3] = -2.0;
    (__return_storage_ptr__->valueMax).m_data[0] = 511.0;
    (__return_storage_ptr__->valueMax).m_data[1] = 511.0;
    (__return_storage_ptr__->valueMax).m_data[2] = 511.0;
    (__return_storage_ptr__->valueMax).m_data[3] = 1.0;
    (__return_storage_ptr__->lookupScale).m_data[0] = 0.0009775171;
    (__return_storage_ptr__->lookupScale).m_data[1] = 0.0009775171;
    (__return_storage_ptr__->lookupScale).m_data[2] = 0.0009775171;
    (__return_storage_ptr__->lookupScale).m_data[3] = 0.33333334;
    uVar3 = 0x3f0000003f000000;
    uVar6 = 0x3f0000003f000000;
  }
  else {
    if (channelType == UNSIGNED_INT_1010102_REV) {
      *(undefined1 (*) [16])(__return_storage_ptr__->valueMin).m_data = (undefined1  [16])0x0;
      (__return_storage_ptr__->valueMax).m_data[0] = 1023.0;
      (__return_storage_ptr__->valueMax).m_data[1] = 1023.0;
      (__return_storage_ptr__->valueMax).m_data[2] = 1023.0;
      (__return_storage_ptr__->valueMax).m_data[3] = 3.0;
      fVar8 = 0.0009775171;
      fVar9 = 0.0009775171;
      fVar10 = 0.0009775171;
      fVar11 = 0.33333334;
    }
    else {
      order = format->order;
      if ((order != DS) && (order != D)) {
        if (channelType == UNORM_SHORT_5551 && order == RGBA) {
          (__return_storage_ptr__->valueMin).m_data[0] = 0.0;
          (__return_storage_ptr__->valueMin).m_data[1] = 0.0;
          (__return_storage_ptr__->valueMin).m_data[2] = 0.0;
          (__return_storage_ptr__->valueMin).m_data[3] = 0.5;
          (__return_storage_ptr__->valueMax).m_data[0] = 1.0;
          (__return_storage_ptr__->valueMax).m_data[1] = 1.0;
          (__return_storage_ptr__->valueMax).m_data[2] = 1.0;
          (__return_storage_ptr__->valueMax).m_data[3] = 1.5;
          (__return_storage_ptr__->lookupScale).m_data[0] = 1.0;
          (__return_storage_ptr__->lookupScale).m_data[1] = 1.0;
          (__return_storage_ptr__->lookupScale).m_data[2] = 1.0;
          (__return_storage_ptr__->lookupScale).m_data[3] = 1.0;
          uVar3 = 0;
          uVar6 = 0;
          goto LAB_003261ca;
        }
        if (channelType == UNSIGNED_SHORT_565) {
          local_48.m_data[0] = 31.0;
          local_48.m_data[1] = 63.0;
          local_48.m_data[2] = 31.0;
          local_48.m_data[3] = 0.0;
          local_58.m_data[1] = 0.015873017;
        }
        else {
          if (channelType != UNSIGNED_SHORT_5551) {
            getFloatChannelValueRange(channelType);
            pTVar1 = getChannelReadSwizzle(order);
            uVar2 = -(uint)(-0x7ffffffd < (int)(pTVar1->components[0] ^ 0x80000000));
            uVar4 = -(uint)(-0x7ffffffd < (int)(pTVar1->components[1] ^ 0x80000000));
            uVar5 = -(uint)(-0x7ffffffd < (int)(pTVar1->components[2] ^ 0x80000000));
            uVar7 = -(uint)(-0x7ffffffd < (int)(pTVar1->components[3] ^ 0x80000000));
            fVar8 = (float)local_38[1].m_data._8_8_;
            fVar9 = SUB84(local_38[1].m_data._8_8_,4);
            local_38[0].m_data[1] = (float)(~uVar4 & (uint)fVar8);
            local_38[0].m_data[0] = (float)(~uVar2 & (uint)fVar8);
            local_38[0].m_data[2] = (float)(~uVar5 & (uint)fVar8);
            local_38[0].m_data[3] = (float)(~uVar7 & (uint)fVar8);
            local_68.m_data[3] = 1.0 / (fVar9 - fVar8);
            local_48.m_data[1] = (float)(~uVar4 & (uint)fVar9);
            local_48.m_data[0] = (float)(~uVar2 & (uint)fVar9);
            local_48.m_data[3] = (float)(~uVar7 & (uint)fVar9);
            local_48.m_data[2] = (float)(~uVar5 & (uint)fVar9);
            local_58.m_data[0] = (float)(uVar2 & 0x3f800000 | ~uVar2 & (uint)local_68.m_data[3]);
            local_58.m_data[1] = (float)(uVar4 & 0x3f800000 | ~uVar4 & (uint)local_68.m_data[3]);
            local_58.m_data[2] = (float)(uVar5 & 0x3f800000 | ~uVar5 & (uint)local_68.m_data[3]);
            local_58.m_data[3] = (float)(uVar7 & 0x3f800000 | ~uVar7 & (uint)local_68.m_data[3]);
            local_68.m_data[3] = local_68.m_data[3] * -fVar8;
            local_68.m_data[0] = (float)(~uVar2 & (uint)local_68.m_data[3]);
            local_68.m_data[1] = (float)(~uVar4 & (uint)local_68.m_data[3]);
            local_68.m_data[2] = (float)(~uVar5 & (uint)local_68.m_data[3]);
            local_68.m_data[3] = (float)(~uVar7 & (uint)local_68.m_data[3]);
            goto LAB_00326318;
          }
          local_48.m_data[0] = 31.0;
          local_48.m_data[1] = 31.0;
          local_48.m_data[2] = 31.0;
          local_48.m_data[3] = 1.0;
          local_58.m_data[1] = 0.032258064;
        }
        local_38[0].m_data[0] = 0.0;
        local_38[0].m_data[1] = 0.0;
        local_38[0].m_data[2] = 0.0;
        local_38[0].m_data[3] = 0.0;
        local_68.m_data[0] = 0.0;
        local_68.m_data[1] = 0.0;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 0.0;
        local_58.m_data[0] = 0.032258064;
        local_58.m_data[2] = 0.032258064;
        local_58.m_data[3] = 1.0;
LAB_00326318:
        TextureFormatInfo::TextureFormatInfo
                  (__return_storage_ptr__,local_38,&local_48,&local_58,&local_68);
        return __return_storage_ptr__;
      }
      *(undefined1 (*) [16])(__return_storage_ptr__->valueMin).m_data = (undefined1  [16])0x0;
      (__return_storage_ptr__->valueMax).m_data[0] = 1.0;
      (__return_storage_ptr__->valueMax).m_data[1] = 1.0;
      (__return_storage_ptr__->valueMax).m_data[2] = 1.0;
      (__return_storage_ptr__->valueMax).m_data[3] = 0.0;
      fVar8 = 1.0;
      fVar9 = 1.0;
      fVar10 = 1.0;
      fVar11 = 1.0;
    }
    uVar3 = 0;
    uVar6 = 0;
    (__return_storage_ptr__->lookupScale).m_data[0] = fVar8;
    (__return_storage_ptr__->lookupScale).m_data[1] = fVar9;
    (__return_storage_ptr__->lookupScale).m_data[2] = fVar10;
    (__return_storage_ptr__->lookupScale).m_data[3] = fVar11;
  }
LAB_003261ca:
  *(undefined8 *)(__return_storage_ptr__->lookupBias).m_data = uVar3;
  *(undefined8 *)((__return_storage_ptr__->lookupBias).m_data + 2) = uVar6;
  return __return_storage_ptr__;
}

Assistant:

TextureFormatInfo getTextureFormatInfo (const TextureFormat& format)
{
	// Special cases.
	if (format.type == TextureFormat::UNSIGNED_INT_1010102_REV)
		return TextureFormatInfo(Vec4(	     0.0f,		    0.0f,		    0.0f,		 0.0f),
								 Vec4(	  1023.0f,		 1023.0f,		 1023.0f,		 3.0f),
								 Vec4(1.0f/1023.f,	1.0f/1023.0f,	1.0f/1023.0f,	1.0f/3.0f),
								 Vec4(	     0.0f,		    0.0f,		    0.0f,		 0.0f));
	if (format.type == TextureFormat::SIGNED_INT_1010102_REV)
		return TextureFormatInfo(Vec4(	  -512.0f,		 -512.0f,		 -512.0f,		-2.0f),
								 Vec4(	   511.0f,		  511.0f,		  511.0f,		 1.0f),
								 Vec4(1.0f/1023.f,	1.0f/1023.0f,	1.0f/1023.0f,	1.0f/3.0f),
								 Vec4(	     0.5f,		    0.5f,		    0.5f,		 0.5f));
	else if (format.order == TextureFormat::D || format.order == TextureFormat::DS)
		return TextureFormatInfo(Vec4(0.0f,	0.0f,	0.0f,	0.0f),
								 Vec4(1.0f,	1.0f,	1.0f,	0.0f),
								 Vec4(1.0f,	1.0f,	1.0f,	1.0f),
								 Vec4(0.0f,	0.0f,	0.0f,	0.0f)); // Depth / stencil formats.
	else if (format == TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_SHORT_5551))
		return TextureFormatInfo(Vec4(0.0f, 0.0f, 0.0f, 0.5f),
								 Vec4(1.0f, 1.0f, 1.0f, 1.5f),
								 Vec4(1.0f, 1.0f, 1.0f, 1.0f),
								 Vec4(0.0f, 0.0f, 0.0f, 0.0f));
	else if (format.type == TextureFormat::UNSIGNED_SHORT_5551)
		return TextureFormatInfo(Vec4(	   0.0f,		  0.0f,		  0.0f,	0.0f),
								 Vec4(	  31.0f,		 31.0f,		 31.0f,	1.0f),
								 Vec4(1.0f/31.f,	1.0f/31.0f,	1.0f/31.0f,	1.0f),
								 Vec4(	   0.0f,		  0.0f,		  0.0f,	0.0f));
	else if (format.type == TextureFormat::UNSIGNED_SHORT_565)
		return TextureFormatInfo(Vec4(	   0.0f,		  0.0f,		  0.0f,	0.0f),
								 Vec4(	  31.0f,		 63.0f,		 31.0f,	0.0f),
								 Vec4(1.0f/31.f,	1.0f/63.0f,	1.0f/31.0f,	1.0f),
								 Vec4(	   0.0f,		  0.0f,		  0.0f,	0.0f));

	const Vec2						cRange		= getFloatChannelValueRange(format.type);
	const TextureSwizzle::Channel*	map			= getChannelReadSwizzle(format.order).components;
	const BVec4						chnMask		= BVec4(deInRange32(map[0], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[1], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[2], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[3], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE);
	const float						scale		= 1.0f / (cRange[1] - cRange[0]);
	const float						bias		= -cRange[0] * scale;

	return TextureFormatInfo(select(cRange[0],	0.0f, chnMask),
							 select(cRange[1],	0.0f, chnMask),
							 select(scale,		1.0f, chnMask),
							 select(bias,		0.0f, chnMask));
}